

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_64299::AssertHexFloatFails(char *s)

{
  bool bVar1;
  size_t sVar2;
  Message *message;
  char *message_00;
  AssertHelper local_40;
  Message local_38;
  Result local_30;
  Enum local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  char *pcStack_10;
  uint32_t actual_bits;
  char *s_local;
  
  local_2c = Error;
  pcStack_10 = s;
  sVar2 = strlen(s);
  local_30 = wabt::ParseFloat(Hexfloat,s,s + sVar2,
                              (uint32_t *)
                              ((long)&gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              + 4));
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_28,"Result::Error",
             "ParseFloat(LiteralType::Hexfloat, s, s + strlen(s), &actual_bits)",&local_2c,&local_30
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    message = testing::Message::operator<<(&local_38,&stack0xfffffffffffffff0);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-literal.cc"
               ,0xa9,message_00);
    testing::internal::AssertHelper::operator=(&local_40,message);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

void AssertHexFloatFails(const char* s) {
  uint32_t actual_bits;
  ASSERT_EQ(Result::Error,
            ParseFloat(LiteralType::Hexfloat, s, s + strlen(s), &actual_bits))
      << s;
}